

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_stepping.cpp
# Opt level: O0

void test_1d_static<5ul,30ul>(void)

{
  ulong uVar1;
  value_type vVar2;
  size_type sVar3;
  value_type vVar4;
  value_type vVar5;
  size_type sVar6;
  int local_164 [2];
  dimensions<5UL> local_159;
  size_type local_158;
  int local_150 [2];
  int i_2;
  int *local_140;
  size_type local_138;
  unsigned_long local_130;
  value_type true_idx;
  int local_120;
  int iStack_11c;
  dimensions<5UL> s;
  int i_1;
  int *local_110;
  size_type local_108;
  int local_fc;
  int local_f8;
  int i;
  int dptr [30];
  unsigned_long local_78;
  size_type local_70;
  unsigned_long local_68;
  size_type local_60;
  unsigned_long local_58;
  size_type local_50;
  bool local_46;
  bool local_45;
  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<6UL>,_std::experimental::dimensions<5UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
  local_44;
  unsigned_long uStack_40;
  layout_mapping_left<dimensions<30UL___5UL>,_dimensions<5UL>,_dimensions<0>_> sub_l;
  size_type local_38;
  unsigned_long local_30;
  size_type local_28;
  int local_1c;
  size_type local_18;
  bool local_e;
  bool local_d;
  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
  local_c [2];
  layout_mapping_left<dimensions<30UL>,_dimensions<1>,_dimensions<0>_> l;
  
  std::experimental::
  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
  ::layout_mapping_regular_precomputed_strides(local_c);
  local_d = std::experimental::detail::
            layout_mapping_regular_base<std::experimental::dimensions<30UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
            ::is_regular();
  local_e = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x25,"void test_1d_static() [N = 5UL, X = 30UL]",&local_d,&local_e);
  local_18 = std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
             ::stride(local_c,0);
  local_1c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x27,"void test_1d_static() [N = 5UL, X = 30UL]",&local_18,&local_1c);
  local_28 = std::experimental::dimensions<30UL>::size((dimensions<30UL> *)local_c);
  local_30 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x29,"void test_1d_static() [N = 5UL, X = 30UL]",&local_28,&local_30);
  local_38 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<30UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
             ::span(&local_c[0].
                     super_layout_mapping_regular_base<std::experimental::dimensions<30UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
                   );
  uStack_40 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x2a,"void test_1d_static() [N = 5UL, X = 30UL]",&local_38,&stack0xffffffffffffffc0);
  std::experimental::
  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<6UL>,_std::experimental::dimensions<5UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
  ::layout_mapping_regular_precomputed_strides(&local_44);
  local_45 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<6UL>,_std::experimental::dimensions<5UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
             ::is_regular();
  local_46 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x30,"void test_1d_static() [N = 5UL, X = 30UL]",&local_45,&local_46);
  local_50 = std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<6UL>,_std::experimental::dimensions<5UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
             ::stride(&local_44,0);
  local_58 = 5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x32,"void test_1d_static() [N = 5UL, X = 30UL]",&local_50,&local_58);
  local_60 = std::experimental::dimensions<6UL>::size((dimensions<6UL> *)&local_44);
  local_68 = 6;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","X / N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x34,"void test_1d_static() [N = 5UL, X = 30UL]",&local_60,&local_68);
  local_70 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<6UL>,_std::experimental::dimensions<5UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
             ::span(&local_44.
                     super_layout_mapping_regular_base<std::experimental::dimensions<6UL>,_std::experimental::dimensions<5UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
                   );
  local_78 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
             ,0x35,"void test_1d_static() [N = 5UL, X = 30UL]",&local_70,&local_78);
  local_fc = 0;
  while( true ) {
    uVar1 = (ulong)local_fc;
    vVar2 = std::experimental::dimensions<30UL>::operator[]<int>((dimensions<30UL> *)local_c,0);
    if (vVar2 <= uVar1) break;
    local_108 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
                ::index<int>(local_c,local_fc);
    boost::detail::test_eq_impl<unsigned_long,int>
              ("(l.index(i))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0x3c,"void test_1d_static() [N = 5UL, X = 30UL]",&local_108,&local_fc);
    sVar3 = std::experimental::
            layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
            ::index<int>(local_c,local_fc);
    local_110 = &local_f8 + sVar3;
    _i_1 = &local_f8 + local_fc;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i)])","&(dptr[i])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0x3e,"void test_1d_static() [N = 5UL, X = 30UL]",&local_110,(int **)&i_1);
    sVar3 = std::experimental::
            layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
            ::index<int>(local_c,local_fc);
    (&local_f8)[sVar3] = 0x2a;
    sVar3 = std::experimental::
            layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
            ::index<int>(local_c,local_fc);
    iStack_11c = 0x2a;
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i)])","42",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0x42,"void test_1d_static() [N = 5UL, X = 30UL]",&local_f8 + sVar3,
               &stack0xfffffffffffffee4);
    local_fc = local_fc + 1;
  }
  local_120 = 0;
  while( true ) {
    uVar1 = (ulong)local_120;
    vVar4 = std::experimental::dimensions<6UL>::operator[]<int>((dimensions<6UL> *)&local_44,0);
    if (vVar4 <= uVar1) break;
    std::experimental::detail::
    layout_mapping_regular_base<std::experimental::dimensions<6UL>,_std::experimental::dimensions<5UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
    ::steps(&local_44.
             super_layout_mapping_regular_base<std::experimental::dimensions<6UL>,_std::experimental::dimensions<5UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
           );
    vVar5 = std::experimental::dimensions<5UL>::operator[]<int>
                      ((dimensions<5UL> *)((long)&true_idx + 7),0);
    local_130 = vVar5 * (long)local_120;
    local_138 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<6UL>,_std::experimental::dimensions<5UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
                ::index<int>(&local_44,local_120);
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(sub_l.index(i))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0x4b,"void test_1d_static() [N = 5UL, X = 30UL]",&local_138,&local_130);
    sVar6 = std::experimental::
            layout_mapping_regular_precomputed_strides<std::experimental::dimensions<6UL>,_std::experimental::dimensions<5UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
            ::index<int>(&local_44,local_120);
    local_140 = &local_f8 + sVar6;
    _i_2 = &local_f8 + local_130;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[sub_l.index(i)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0x4d,"void test_1d_static() [N = 5UL, X = 30UL]",&local_140,(int **)&i_2);
    sVar6 = std::experimental::
            layout_mapping_regular_precomputed_strides<std::experimental::dimensions<6UL>,_std::experimental::dimensions<5UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
            ::index<int>(&local_44,local_120);
    (&local_f8)[sVar6] = 0x11;
    sVar6 = std::experimental::
            layout_mapping_regular_precomputed_strides<std::experimental::dimensions<6UL>,_std::experimental::dimensions<5UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
            ::index<int>(&local_44,local_120);
    local_150[1] = 0x11;
    boost::detail::test_eq_impl<int,int>
              ("(dptr[sub_l.index(i)])","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0x51,"void test_1d_static() [N = 5UL, X = 30UL]",&local_f8 + sVar6,local_150 + 1);
    local_120 = local_120 + 1;
  }
  local_150[0] = 0;
  while( true ) {
    uVar1 = (ulong)local_150[0];
    vVar2 = std::experimental::dimensions<30UL>::operator[]<int>((dimensions<30UL> *)local_c,0);
    if (vVar2 <= uVar1) break;
    local_158 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
                ::index<int>(local_c,local_150[0]);
    boost::detail::test_eq_impl<unsigned_long,int>
              ("(l.index(i))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
               ,0x57,"void test_1d_static() [N = 5UL, X = 30UL]",&local_158,local_150);
    uVar1 = (ulong)local_150[0];
    std::experimental::detail::
    layout_mapping_regular_base<std::experimental::dimensions<6UL>,_std::experimental::dimensions<5UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
    ::steps(&local_44.
             super_layout_mapping_regular_base<std::experimental::dimensions<6UL>,_std::experimental::dimensions<5UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
           );
    vVar5 = std::experimental::dimensions<5UL>::operator[]<int>(&local_159,0);
    if (uVar1 % vVar5 == 0) {
      sVar3 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
              ::index<int>(local_c,local_150[0]);
      local_164[1] = 0x11;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i)])","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                 ,0x5c,"void test_1d_static() [N = 5UL, X = 30UL]",&local_f8 + sVar3,local_164 + 1);
    }
    else {
      sVar3 = std::experimental::
              layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL>_>
              ::index<int>(local_c,local_150[0]);
      local_164[0] = 0x2a;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping.cpp"
                 ,0x61,"void test_1d_static() [N = 5UL, X = 30UL]",&local_f8 + sVar3,local_164);
    }
    local_150[0] = local_150[0] + 1;
  }
  return;
}

Assistant:

void test_1d_static()
{ // {{{
    static_assert(0 == (X % N), "X must be divisable by N");

    layout_mapping_left<
        dimensions<X>, dimensions<1>, dimensions<0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);

    BOOST_TEST_EQ((l.size()), X);
    BOOST_TEST_EQ((l.span()), X);

    layout_mapping_left<
        dimensions<X / N>, dimensions<N>, dimensions<0>
    > const sub_l{};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), N);

    BOOST_TEST_EQ((sub_l.size()), X / N);
    BOOST_TEST_EQ((sub_l.span()), X);

    int dptr[X];

    // Set all elements to 42.
    for (auto i = 0; i < l[0]; ++i)
    {
        BOOST_TEST_EQ((l.index(i)), i);

        BOOST_TEST_EQ(&(dptr[l.index(i)]), &(dptr[i]));

        dptr[l.index(i)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i)]), 42);
    }

    // Set every Nth element to 17. 
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const s = sub_l.steps();
        auto const true_idx = (s[0] * i);

        BOOST_TEST_EQ((sub_l.index(i)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i)] = 17;

        BOOST_TEST_EQ((dptr[sub_l.index(i)]), 17);
    }

    // Check final structure. 
    for (auto i = 0; i < l[0]; ++i)
    {
        BOOST_TEST_EQ((l.index(i)), i);

        // Element not in the strided sub-box.
        if (0 == (i % sub_l.steps()[0]))
        {
            BOOST_TEST_EQ((dptr[l.index(i)]), 17);
        }
        // Element not in the strided sub-box.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i)]), 42);
        }
    }
}